

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O3

void If_ManStop(If_Man_t *p)

{
  Vec_Mem_t *pVVar1;
  long lVar2;
  void **ppvVar3;
  Hash_IntMan_t *__ptr;
  int *piVar4;
  Vec_Wec_t *__ptr_00;
  uint uVar5;
  ulong uVar6;
  If_Par_t *pIVar7;
  long lVar8;
  int iVar9;
  char *pcVar10;
  Vec_Wrd_t *pVVar11;
  Vec_Str_t *__ptr_01;
  Vec_Ptr_t *pVVar12;
  void *pvVar13;
  Vec_Int_t *pVVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  
  pIVar7 = p->pPars;
  pcVar10 = (char *)p;
  if (pIVar7->fVerbose != 0) {
    if (p->vCutData != (Vec_Int_t *)0x0) {
      If_ManCacheAnalize(p);
      pIVar7 = p->pPars;
      if (pIVar7->fVerbose == 0) goto LAB_0042ce39;
    }
    if (pIVar7->fTruth != 0) {
      uVar6 = 6;
      if (6 < pIVar7->nLutSize) {
        uVar6 = (ulong)(uint)pIVar7->nLutSize;
      }
      lVar8 = 0;
      uVar16 = 0;
      do {
        uVar16 = (ulong)(uint)((int)uVar16 + p->vTtMem[lVar8 + 6]->nEntries);
        lVar8 = lVar8 + 1;
      } while (uVar6 - 5 != lVar8);
      lVar8 = 0;
      iVar9 = 0;
      do {
        pVVar1 = p->vTtMem[lVar8 + 6];
        iVar9 = iVar9 + (int)((double)pVVar1->nPageAlloc * 8.0 +
                              (double)(pVVar1->iPage + 1) *
                              (double)(1 << ((byte)pVVar1->LogPageSze & 0x1f)) *
                              (double)pVVar1->nEntrySize * 8.0 + 48.0);
        lVar8 = lVar8 + 1;
      } while (uVar6 - 5 != lVar8);
      pcVar10 = "Unique truth tables = %d   Memory = %.2f MB   ";
      printf("Unique truth tables = %d   Memory = %.2f MB   ",(double)iVar9 * 9.5367431640625e-07,
             uVar16);
      lVar8 = p->timeCache[4];
      Abc_Print((int)pcVar10,"%s =","Time");
      Abc_Print((int)pcVar10,"%9.2f sec\n",(double)lVar8 / 1000000.0);
      iVar9 = p->nCacheMisses;
      if (iVar9 != 0) {
        pcVar10 = "Cache hits = %d. Cache misses = %d  (%.2f %%)\n";
        printf("Cache hits = %d. Cache misses = %d  (%.2f %%)\n",
               ((double)iVar9 * 100.0) / (double)(p->nCacheHits + iVar9));
        lVar8 = p->timeCache[0];
        Abc_Print((int)pcVar10,"%s =","Non-DSD   ");
        Abc_Print((int)pcVar10,"%9.2f sec\n",(double)lVar8 / 1000000.0);
        lVar8 = p->timeCache[1];
        Abc_Print((int)pcVar10,"%s =","DSD hits  ");
        Abc_Print((int)pcVar10,"%9.2f sec\n",(double)lVar8 / 1000000.0);
        lVar8 = p->timeCache[2];
        Abc_Print((int)pcVar10,"%s =","DSD misses");
        Abc_Print((int)pcVar10,"%9.2f sec\n",(double)lVar8 / 1000000.0);
        lVar8 = p->timeCache[1];
        lVar15 = p->timeCache[0];
        lVar2 = p->timeCache[2];
        Abc_Print((int)pcVar10,"%s =","TOTAL     ");
        Abc_Print((int)pcVar10,"%9.2f sec\n",(double)(lVar8 + lVar15 + lVar2) / 1000000.0);
        lVar8 = p->timeCache[3];
        Abc_Print((int)pcVar10,"%s =","Canon     ");
        Abc_Print((int)pcVar10,"%9.2f sec\n",(double)lVar8 / 1000000.0);
      }
    }
  }
LAB_0042ce39:
  if ((p->pPars->fVerbose != 0) && (p->nCutsUselessAll != 0)) {
    uVar6 = 0;
    do {
      if (p->nCutsUseless[uVar6] != 0) {
        iVar9 = 1;
        if (1 < p->nCutsCount[uVar6]) {
          iVar9 = p->nCutsCount[uVar6];
        }
        Abc_Print((int)pcVar10,"Useless cuts %2d  = %9d  (out of %9d)  (%6.2f %%)\n",
                  ((double)p->nCutsUseless[uVar6] * 100.0) / (double)iVar9,uVar6 & 0xffffffff);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x11);
    iVar9 = 1;
    if (1 < p->nCutsCountAll) {
      iVar9 = p->nCutsCountAll;
    }
    Abc_Print((int)pcVar10,"Useless cuts all = %9d  (out of %9d)  (%6.2f %%)\n",
              ((double)p->nCutsUselessAll * 100.0) / (double)iVar9);
  }
  if (p->pIfDsdMan != (If_DsdMan_t *)0x0) {
    p->pIfDsdMan = (If_DsdMan_t *)0x0;
  }
  if ((p->pPars->fUseDsd != 0) && (p->nCountNonDec[0] != 0 || p->nCountNonDec[1] != 0)) {
    printf("NonDec0 = %d.  NonDec1 = %d.\n");
  }
  pVVar14 = p->vCoAttrs;
  if (pVVar14 != (Vec_Int_t *)0x0) {
    if (pVVar14->pArray != (int *)0x0) {
      free(pVVar14->pArray);
      p->vCoAttrs->pArray = (int *)0x0;
      pVVar14 = p->vCoAttrs;
      if (pVVar14 == (Vec_Int_t *)0x0) goto LAB_0042cf7b;
    }
    free(pVVar14);
    p->vCoAttrs = (Vec_Int_t *)0x0;
  }
LAB_0042cf7b:
  pVVar12 = p->vCis;
  ppvVar3 = pVVar12->pArray;
  if (ppvVar3 != (void **)0x0) {
    free(ppvVar3);
  }
  free(pVVar12);
  pVVar12 = p->vCos;
  ppvVar3 = pVVar12->pArray;
  if (ppvVar3 != (void **)0x0) {
    free(ppvVar3);
  }
  free(pVVar12);
  pVVar12 = p->vObjs;
  ppvVar3 = pVVar12->pArray;
  if (ppvVar3 != (void **)0x0) {
    free(ppvVar3);
  }
  free(pVVar12);
  pVVar12 = p->vTemp;
  ppvVar3 = pVVar12->pArray;
  if (ppvVar3 != (void **)0x0) {
    free(ppvVar3);
  }
  free(pVVar12);
  pVVar14 = p->vCover;
  if (pVVar14 != (Vec_Int_t *)0x0) {
    if (pVVar14->pArray != (int *)0x0) {
      free(pVVar14->pArray);
      p->vCover->pArray = (int *)0x0;
      pVVar14 = p->vCover;
      if (pVVar14 == (Vec_Int_t *)0x0) goto LAB_0042d02b;
    }
    free(pVVar14);
    p->vCover = (Vec_Int_t *)0x0;
  }
LAB_0042d02b:
  pVVar14 = p->vArray;
  if (pVVar14 != (Vec_Int_t *)0x0) {
    if (pVVar14->pArray != (int *)0x0) {
      free(pVVar14->pArray);
      p->vArray->pArray = (int *)0x0;
      pVVar14 = p->vArray;
      if (pVVar14 == (Vec_Int_t *)0x0) goto LAB_0042d073;
    }
    free(pVVar14);
    p->vArray = (Vec_Int_t *)0x0;
  }
LAB_0042d073:
  pVVar11 = p->vAnds;
  if (pVVar11 != (Vec_Wrd_t *)0x0) {
    if (pVVar11->pArray != (word *)0x0) {
      free(pVVar11->pArray);
      p->vAnds->pArray = (word *)0x0;
      pVVar11 = p->vAnds;
      if (pVVar11 == (Vec_Wrd_t *)0x0) goto LAB_0042d0bb;
    }
    free(pVVar11);
    p->vAnds = (Vec_Wrd_t *)0x0;
  }
LAB_0042d0bb:
  pVVar11 = p->vAndGate;
  if (pVVar11 != (Vec_Wrd_t *)0x0) {
    if (pVVar11->pArray != (word *)0x0) {
      free(pVVar11->pArray);
      p->vAndGate->pArray = (word *)0x0;
      pVVar11 = p->vAndGate;
      if (pVVar11 == (Vec_Wrd_t *)0x0) goto LAB_0042d103;
    }
    free(pVVar11);
    p->vAndGate = (Vec_Wrd_t *)0x0;
  }
LAB_0042d103:
  pVVar11 = p->vOrGate;
  if (pVVar11 != (Vec_Wrd_t *)0x0) {
    if (pVVar11->pArray != (word *)0x0) {
      free(pVVar11->pArray);
      p->vOrGate->pArray = (word *)0x0;
      pVVar11 = p->vOrGate;
      if (pVVar11 == (Vec_Wrd_t *)0x0) goto LAB_0042d14b;
    }
    free(pVVar11);
    p->vOrGate = (Vec_Wrd_t *)0x0;
  }
LAB_0042d14b:
  pVVar12 = p->vObjsRev;
  if (pVVar12 != (Vec_Ptr_t *)0x0) {
    if (pVVar12->pArray != (void **)0x0) {
      free(pVVar12->pArray);
      p->vObjsRev->pArray = (void **)0x0;
      pVVar12 = p->vObjsRev;
      if (pVVar12 == (Vec_Ptr_t *)0x0) goto LAB_0042d187;
    }
    free(pVVar12);
    p->vObjsRev = (Vec_Ptr_t *)0x0;
  }
LAB_0042d187:
  pVVar12 = p->vLatchOrder;
  if (pVVar12 != (Vec_Ptr_t *)0x0) {
    if (pVVar12->pArray != (void **)0x0) {
      free(pVVar12->pArray);
      p->vLatchOrder->pArray = (void **)0x0;
      pVVar12 = p->vLatchOrder;
      if (pVVar12 == (Vec_Ptr_t *)0x0) goto LAB_0042d1cf;
    }
    free(pVVar12);
    p->vLatchOrder = (Vec_Ptr_t *)0x0;
  }
LAB_0042d1cf:
  pVVar14 = p->vLags;
  if (pVVar14 != (Vec_Int_t *)0x0) {
    if (pVVar14->pArray != (int *)0x0) {
      free(pVVar14->pArray);
      p->vLags->pArray = (int *)0x0;
      pVVar14 = p->vLags;
      if (pVVar14 == (Vec_Int_t *)0x0) goto LAB_0042d217;
    }
    free(pVVar14);
    p->vLags = (Vec_Int_t *)0x0;
  }
LAB_0042d217:
  pVVar14 = p->vDump;
  if (pVVar14 != (Vec_Int_t *)0x0) {
    if (pVVar14->pArray != (int *)0x0) {
      free(pVVar14->pArray);
      p->vDump->pArray = (int *)0x0;
      pVVar14 = p->vDump;
      if (pVVar14 == (Vec_Int_t *)0x0) goto LAB_0042d25f;
    }
    free(pVVar14);
    p->vDump = (Vec_Int_t *)0x0;
  }
LAB_0042d25f:
  lVar8 = 0xab;
  do {
    pvVar13 = *(void **)(p->nObjs + lVar8 * 2 + -0x10);
    if (pvVar13 != (void *)0x0) {
      if (*(void **)((long)pvVar13 + 8) != (void *)0x0) {
        free(*(void **)((long)pvVar13 + 8));
        *(undefined8 *)(*(long *)(p->nObjs + lVar8 * 2 + -0x10) + 8) = 0;
        pvVar13 = *(void **)(p->nObjs + lVar8 * 2 + -0x10);
        if (pvVar13 == (void *)0x0) goto LAB_0042d2a6;
      }
      free(pvVar13);
      (p->nObjs + lVar8 * 2 + -0x10)[0] = 0;
      (p->nObjs + lVar8 * 2 + -0x10)[1] = 0;
    }
LAB_0042d2a6:
    uVar5 = p->pPars->nLutSize;
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 7) {
      uVar6 = 6;
    }
    uVar16 = lVar8 - 0xa5;
    lVar8 = lVar8 + 1;
  } while (uVar16 < uVar6);
  lVar8 = 0xbb;
  do {
    pvVar13 = *(void **)(p->nObjs + lVar8 * 2 + -0x10);
    if (pvVar13 != (void *)0x0) {
      if (*(void **)((long)pvVar13 + 8) != (void *)0x0) {
        free(*(void **)((long)pvVar13 + 8));
        *(undefined8 *)(*(long *)(p->nObjs + lVar8 * 2 + -0x10) + 8) = 0;
        pvVar13 = *(void **)(p->nObjs + lVar8 * 2 + -0x10);
        if (pvVar13 == (void *)0x0) goto LAB_0042d30c;
      }
      free(pvVar13);
      (p->nObjs + lVar8 * 2 + -0x10)[0] = 0;
      (p->nObjs + lVar8 * 2 + -0x10)[1] = 0;
    }
LAB_0042d30c:
    uVar5 = p->pPars->nLutSize;
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 7) {
      uVar6 = 6;
    }
    uVar16 = lVar8 - 0xb5;
    lVar8 = lVar8 + 1;
  } while (uVar16 < uVar6);
  lVar8 = 0xcb;
  do {
    pvVar13 = *(void **)(p->nObjs + lVar8 * 2 + -0x10);
    if (pvVar13 != (void *)0x0) {
      if (*(void **)((long)pvVar13 + 8) != (void *)0x0) {
        free(*(void **)((long)pvVar13 + 8));
        *(undefined8 *)(*(long *)(p->nObjs + lVar8 * 2 + -0x10) + 8) = 0;
        pvVar13 = *(void **)(p->nObjs + lVar8 * 2 + -0x10);
        if (pvVar13 == (void *)0x0) goto LAB_0042d372;
      }
      free(pvVar13);
      (p->nObjs + lVar8 * 2 + -0x10)[0] = 0;
      (p->nObjs + lVar8 * 2 + -0x10)[1] = 0;
    }
LAB_0042d372:
    uVar5 = p->pPars->nLutSize;
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 7) {
      uVar6 = 6;
    }
    uVar16 = lVar8 - 0xc5;
    lVar8 = lVar8 + 1;
  } while (uVar16 < uVar6);
  lVar8 = 0xdb;
  do {
    pvVar13 = *(void **)(p->nObjs + lVar8 * 2 + -0x10);
    if (pvVar13 != (void *)0x0) {
      if (*(void **)((long)pvVar13 + 8) != (void *)0x0) {
        free(*(void **)((long)pvVar13 + 8));
        *(undefined8 *)(*(long *)(p->nObjs + lVar8 * 2 + -0x10) + 8) = 0;
        pvVar13 = *(void **)(p->nObjs + lVar8 * 2 + -0x10);
        if (pvVar13 == (void *)0x0) goto LAB_0042d3d8;
      }
      free(pvVar13);
      (p->nObjs + lVar8 * 2 + -0x10)[0] = 0;
      (p->nObjs + lVar8 * 2 + -0x10)[1] = 0;
    }
LAB_0042d3d8:
    uVar5 = p->pPars->nLutSize;
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 7) {
      uVar6 = 6;
    }
    uVar16 = lVar8 - 0xd5;
    lVar8 = lVar8 + 1;
  } while (uVar16 < uVar6);
  pVVar14 = p->vCutData;
  if (pVVar14 != (Vec_Int_t *)0x0) {
    if (pVVar14->pArray != (int *)0x0) {
      free(pVVar14->pArray);
      p->vCutData->pArray = (int *)0x0;
      pVVar14 = p->vCutData;
      if (pVVar14 == (Vec_Int_t *)0x0) goto LAB_0042d43f;
    }
    free(pVVar14);
    p->vCutData = (Vec_Int_t *)0x0;
  }
LAB_0042d43f:
  pVVar14 = p->vPairRes;
  if (pVVar14 != (Vec_Int_t *)0x0) {
    if (pVVar14->pArray != (int *)0x0) {
      free(pVVar14->pArray);
      p->vPairRes->pArray = (int *)0x0;
      pVVar14 = p->vPairRes;
      if (pVVar14 == (Vec_Int_t *)0x0) goto LAB_0042d487;
    }
    free(pVVar14);
    p->vPairRes = (Vec_Int_t *)0x0;
  }
LAB_0042d487:
  __ptr_01 = p->vPairPerms;
  if (__ptr_01 != (Vec_Str_t *)0x0) {
    if (__ptr_01->pArray != (char *)0x0) {
      free(__ptr_01->pArray);
      p->vPairPerms->pArray = (char *)0x0;
      __ptr_01 = p->vPairPerms;
      if (__ptr_01 == (Vec_Str_t *)0x0) goto LAB_0042d4cf;
    }
    free(__ptr_01);
    p->vPairPerms = (Vec_Str_t *)0x0;
  }
LAB_0042d4cf:
  pVVar12 = p->vVisited;
  if (pVVar12 != (Vec_Ptr_t *)0x0) {
    if (pVVar12->pArray != (void **)0x0) {
      free(pVVar12->pArray);
      p->vVisited->pArray = (void **)0x0;
      pVVar12 = p->vVisited;
      if (pVVar12 == (Vec_Ptr_t *)0x0) goto LAB_0042d517;
    }
    free(pVVar12);
    p->vVisited = (Vec_Ptr_t *)0x0;
  }
LAB_0042d517:
  __ptr = p->vPairHash;
  if (__ptr != (Hash_IntMan_t *)0x0) {
    pVVar14 = __ptr->vObjs;
    piVar4 = pVVar14->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
    }
    free(pVVar14);
    pVVar14 = __ptr->vTable;
    piVar4 = pVVar14->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
    }
    free(pVVar14);
    free(__ptr);
  }
  lVar8 = 0x8b;
  do {
    lVar15 = *(long *)(p->nObjs + lVar8 * 2 + -0x10);
    if (lVar15 != 0) {
      pvVar13 = *(void **)(lVar15 + 0x20);
      if (pvVar13 != (void *)0x0) {
        if (*(void **)((long)pvVar13 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar13 + 8));
          *(undefined8 *)(*(long *)(lVar15 + 0x20) + 8) = 0;
          pvVar13 = *(void **)(lVar15 + 0x20);
          if (pvVar13 == (void *)0x0) goto LAB_0042d5a9;
        }
        free(pvVar13);
        *(undefined8 *)(lVar15 + 0x20) = 0;
      }
LAB_0042d5a9:
      pvVar13 = *(void **)(lVar15 + 0x28);
      if (pvVar13 != (void *)0x0) {
        if (*(void **)((long)pvVar13 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar13 + 8));
          *(undefined8 *)(*(long *)(lVar15 + 0x28) + 8) = 0;
          pvVar13 = *(void **)(lVar15 + 0x28);
          if (pvVar13 == (void *)0x0) goto LAB_0042d5e5;
        }
        free(pvVar13);
        *(undefined8 *)(lVar15 + 0x28) = 0;
      }
    }
LAB_0042d5e5:
    uVar5 = p->pPars->nLutSize;
    uVar6 = 6;
    if (6 < (int)uVar5) {
      uVar6 = (ulong)uVar5;
    }
    uVar16 = lVar8 - 0x85;
    lVar8 = lVar8 + 1;
  } while (uVar16 < uVar6);
  uVar6 = 6;
  do {
    pVVar1 = p->vTtMem[uVar6];
    if (pVVar1 != (Vec_Mem_t *)0x0) {
      iVar9 = pVVar1->iPage;
      if (-1 < iVar9) {
        lVar8 = -1;
        do {
          if (pVVar1->ppPages[lVar8 + 1] != (word *)0x0) {
            free(pVVar1->ppPages[lVar8 + 1]);
            pVVar1->ppPages[lVar8 + 1] = (word *)0x0;
            iVar9 = pVVar1->iPage;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < iVar9);
      }
      if (pVVar1->ppPages != (word **)0x0) {
        free(pVVar1->ppPages);
      }
      free(pVVar1);
      p->vTtMem[uVar6] = (Vec_Mem_t *)0x0;
      uVar5 = p->pPars->nLutSize;
    }
    uVar16 = 6;
    if (6 < (int)uVar5) {
      uVar16 = (ulong)uVar5;
    }
    bVar17 = uVar6 < uVar16;
    uVar6 = uVar6 + 1;
  } while (bVar17);
  uVar6 = 6;
  do {
    __ptr_00 = p->vTtIsops[uVar6];
    if (__ptr_00 != (Vec_Wec_t *)0x0) {
      iVar9 = __ptr_00->nCap;
      pVVar14 = __ptr_00->pArray;
      if (iVar9 < 1) {
        if (pVVar14 != (Vec_Int_t *)0x0) goto LAB_0042d6fe;
      }
      else {
        lVar8 = 8;
        lVar15 = 0;
        do {
          pvVar13 = *(void **)((long)&pVVar14->nCap + lVar8);
          if (pvVar13 != (void *)0x0) {
            free(pvVar13);
            pVVar14 = __ptr_00->pArray;
            *(undefined8 *)((long)&pVVar14->nCap + lVar8) = 0;
            iVar9 = __ptr_00->nCap;
          }
          lVar15 = lVar15 + 1;
          lVar8 = lVar8 + 0x10;
        } while (lVar15 < iVar9);
LAB_0042d6fe:
        free(pVVar14);
      }
      free(__ptr_00);
      p->vTtIsops[uVar6] = (Vec_Wec_t *)0x0;
      uVar5 = p->pPars->nLutSize;
    }
    uVar16 = 6;
    if (6 < (int)uVar5) {
      uVar16 = (ulong)uVar5;
    }
    bVar17 = uVar6 < uVar16;
    uVar6 = uVar6 + 1;
  } while (bVar17);
  lVar8 = 0xeb;
  do {
    pvVar13 = *(void **)(p->nObjs + lVar8 * 2 + -0x10);
    if (pvVar13 != (void *)0x0) {
      if (*(void **)((long)pvVar13 + 8) != (void *)0x0) {
        free(*(void **)((long)pvVar13 + 8));
        *(undefined8 *)(*(long *)(p->nObjs + lVar8 * 2 + -0x10) + 8) = 0;
        pvVar13 = *(void **)(p->nObjs + lVar8 * 2 + -0x10);
        if (pvVar13 == (void *)0x0) goto LAB_0042d77f;
      }
      free(pvVar13);
      (p->nObjs + lVar8 * 2 + -0x10)[0] = 0;
      (p->nObjs + lVar8 * 2 + -0x10)[1] = 0;
    }
LAB_0042d77f:
    uVar5 = p->pPars->nLutSize;
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 7) {
      uVar6 = 6;
    }
    uVar16 = lVar8 - 0xe5;
    lVar8 = lVar8 + 1;
  } while (uVar16 < uVar6);
  Mem_FixedStop(p->pMemObj,0);
  pVVar1 = p->vTtMem6;
  if (pVVar1 == (Vec_Mem_t *)0x0) goto LAB_0042d89f;
  pVVar14 = pVVar1->vTable;
  if (pVVar14 != (Vec_Int_t *)0x0) {
    if (pVVar14->pArray != (int *)0x0) {
      free(pVVar14->pArray);
      pVVar1->vTable->pArray = (int *)0x0;
      pVVar14 = pVVar1->vTable;
      if (pVVar14 == (Vec_Int_t *)0x0) goto LAB_0042d7f8;
    }
    free(pVVar14);
    pVVar1->vTable = (Vec_Int_t *)0x0;
  }
LAB_0042d7f8:
  pVVar14 = pVVar1->vNexts;
  if (pVVar14 != (Vec_Int_t *)0x0) {
    if (pVVar14->pArray != (int *)0x0) {
      free(pVVar14->pArray);
      pVVar1->vNexts->pArray = (int *)0x0;
      pVVar14 = pVVar1->vNexts;
      if (pVVar14 == (Vec_Int_t *)0x0) goto LAB_0042d834;
    }
    free(pVVar14);
    pVVar1->vNexts = (Vec_Int_t *)0x0;
  }
LAB_0042d834:
  pVVar1 = p->vTtMem6;
  if (pVVar1 != (Vec_Mem_t *)0x0) {
    iVar9 = pVVar1->iPage;
    if (-1 < iVar9) {
      lVar8 = -1;
      do {
        if (pVVar1->ppPages[lVar8 + 1] != (word *)0x0) {
          free(pVVar1->ppPages[lVar8 + 1]);
          pVVar1->ppPages[lVar8 + 1] = (word *)0x0;
          iVar9 = pVVar1->iPage;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < iVar9);
    }
    if (pVVar1->ppPages != (word **)0x0) {
      free(pVVar1->ppPages);
    }
    free(pVVar1);
    p->vTtMem6 = (Vec_Mem_t *)0x0;
  }
LAB_0042d89f:
  if (p->pMemCi != (If_Set_t *)0x0) {
    free(p->pMemCi);
    p->pMemCi = (If_Set_t *)0x0;
  }
  if (p->pMemAnd != (If_Set_t *)0x0) {
    free(p->pMemAnd);
    p->pMemAnd = (If_Set_t *)0x0;
  }
  if (p->puTemp[0] != (uint *)0x0) {
    free(p->puTemp[0]);
    p->puTemp[0] = (uint *)0x0;
  }
  if (p->puTempW != (word *)0x0) {
    free(p->puTempW);
    p->puTempW = (word *)0x0;
  }
  pIVar7 = p->pPars;
  if (pIVar7->pTimesArr != (float *)0x0) {
    free(pIVar7->pTimesArr);
    pIVar7 = p->pPars;
    pIVar7->pTimesArr = (float *)0x0;
  }
  if (pIVar7->pTimesReq != (float *)0x0) {
    free(pIVar7->pTimesReq);
    p->pPars->pTimesReq = (float *)0x0;
  }
  if (p->pManTim != (Tim_Man_t *)0x0) {
    Tim_ManStop(p->pManTim);
  }
  pVVar14 = p->vSwitching;
  if (pVVar14 != (Vec_Int_t *)0x0) {
    if (pVVar14->pArray != (int *)0x0) {
      free(pVVar14->pArray);
    }
    free(pVVar14);
  }
  if (p->pPars->fUseBat != 0) {
    Bat_ManFuncSetdownTable();
  }
  if (p->pHashTable[0] != (void **)0x0) {
    free(p->pHashTable[0]);
    p->pHashTable[0] = (void **)0x0;
  }
  if (p->pHashTable[1] != (void **)0x0) {
    free(p->pHashTable[1]);
    p->pHashTable[1] = (void **)0x0;
  }
  if (p->pMemEntries != (Mem_Fixed_t *)0x0) {
    Mem_FixedStop(p->pMemEntries,0);
  }
  if (p->pName != (char *)0x0) {
    free(p->pName);
  }
  free(p);
  return;
}

Assistant:

void If_ManStop( If_Man_t * p )
{
    extern void If_ManCacheAnalize( If_Man_t * p );
    int i;
    if ( p->pPars->fVerbose && p->vCutData )
        If_ManCacheAnalize( p );
    if ( p->pPars->fVerbose && p->pPars->fTruth )
    {
        int nUnique = 0, nMemTotal = 0;
        for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
            nUnique += Vec_MemEntryNum(p->vTtMem[i]);
        for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
            nMemTotal += (int)Vec_MemMemory(p->vTtMem[i]);
        printf( "Unique truth tables = %d   Memory = %.2f MB   ", nUnique, 1.0 * nMemTotal / (1<<20) ); 
        Abc_PrintTime( 1, "Time", p->timeCache[4] );
        if ( p->nCacheMisses )
        {
            printf( "Cache hits = %d. Cache misses = %d  (%.2f %%)\n", p->nCacheHits, p->nCacheMisses, 100.0 * p->nCacheMisses / (p->nCacheHits + p->nCacheMisses) ); 
            Abc_PrintTime( 1, "Non-DSD   ", p->timeCache[0] );
            Abc_PrintTime( 1, "DSD hits  ", p->timeCache[1] );
            Abc_PrintTime( 1, "DSD misses", p->timeCache[2] );
            Abc_PrintTime( 1, "TOTAL     ", p->timeCache[0] + p->timeCache[1] + p->timeCache[2] );
            Abc_PrintTime( 1, "Canon     ", p->timeCache[3] );
        }
    }
    if ( p->pPars->fVerbose && p->nCutsUselessAll )
    {
        for ( i = 0; i <= 16; i++ )
            if ( p->nCutsUseless[i] )
                Abc_Print( 1, "Useless cuts %2d  = %9d  (out of %9d)  (%6.2f %%)\n", i, p->nCutsUseless[i], p->nCutsCount[i], 100.0*p->nCutsUseless[i]/Abc_MaxInt(p->nCutsCount[i],1) );
        Abc_Print( 1, "Useless cuts all = %9d  (out of %9d)  (%6.2f %%)\n", p->nCutsUselessAll, p->nCutsCountAll, 100.0*p->nCutsUselessAll/Abc_MaxInt(p->nCutsCountAll,1) );
    }
//    if ( p->pPars->fVerbose && p->nCuts5 )
//        Abc_Print( 1, "Statistics about 5-cuts: Total = %d  Non-decomposable = %d (%.2f %%)\n", p->nCuts5, p->nCuts5-p->nCuts5a, 100.0*(p->nCuts5-p->nCuts5a)/p->nCuts5 );
    if ( p->pIfDsdMan )
        p->pIfDsdMan = NULL;
    if ( p->pPars->fUseDsd && (p->nCountNonDec[0] || p->nCountNonDec[1]) )
        printf( "NonDec0 = %d.  NonDec1 = %d.\n", p->nCountNonDec[0], p->nCountNonDec[1] );
    Vec_IntFreeP( &p->vCoAttrs );
    Vec_PtrFree( p->vCis );
    Vec_PtrFree( p->vCos );
    Vec_PtrFree( p->vObjs );
    Vec_PtrFree( p->vTemp );
    Vec_IntFreeP( &p->vCover );
    Vec_IntFreeP( &p->vArray );
    Vec_WrdFreeP( &p->vAnds );
    Vec_WrdFreeP( &p->vAndGate );
    Vec_WrdFreeP( &p->vOrGate );
    Vec_PtrFreeP( &p->vObjsRev );
    Vec_PtrFreeP( &p->vLatchOrder );
    Vec_IntFreeP( &p->vLags );
    Vec_IntFreeP( &p->vDump );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_IntFreeP( &p->vTtDsds[i] );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_StrFreeP( &p->vTtPerms[i] );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_StrFreeP( &p->vTtVars[i] );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_IntFreeP( &p->vTtDecs[i] );
    Vec_IntFreeP( &p->vCutData );
    Vec_IntFreeP( &p->vPairRes );
    Vec_StrFreeP( &p->vPairPerms );
    Vec_PtrFreeP( &p->vVisited );
    if ( p->vPairHash )
        Hash_IntManStop( p->vPairHash );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_MemHashFree( p->vTtMem[i] );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_MemFreeP( &p->vTtMem[i] );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_WecFreeP( &p->vTtIsops[i] );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_IntFreeP( &p->vTtOccurs[i] );
    Mem_FixedStop( p->pMemObj, 0 );
    if ( p->vTtMem6 )
    {
        Vec_MemHashFree( p->vTtMem6 );
        Vec_MemFreeP( &p->vTtMem6 );
    }
    ABC_FREE( p->pMemCi );
    ABC_FREE( p->pMemAnd );
    ABC_FREE( p->puTemp[0] );
    ABC_FREE( p->puTempW );
    // free pars memory
    ABC_FREE( p->pPars->pTimesArr );
    ABC_FREE( p->pPars->pTimesReq );
    if ( p->pManTim )
        Tim_ManStop( p->pManTim );
    if ( p->vSwitching )
        Vec_IntFree( p->vSwitching );
    if ( p->pPars->fUseBat )
    {
        extern void Bat_ManFuncSetdownTable();
        Bat_ManFuncSetdownTable();
    }
    // hash table
//    if ( p->pPars->fVerbose && p->nTableEntries[0] )
//        printf( "Hash table 2:  Entries = %7d.  Size = %7d.\n", p->nTableEntries[0], p->nTableSize[0] );
//    if ( p->pPars->fVerbose && p->nTableEntries[1] )
//        printf( "Hash table 3:  Entries = %7d.  Size = %7d.\n", p->nTableEntries[1], p->nTableSize[1] );
    ABC_FREE( p->pHashTable[0] );
    ABC_FREE( p->pHashTable[1] );
    if ( p->pMemEntries )
        Mem_FixedStop( p->pMemEntries, 0 );
    ABC_FREE( p->pName );
    ABC_FREE( p );
}